

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O3

MovePack * pyramid_movePackGet(Board *board)

{
  byte bVar1;
  MovePack *movePack;
  Spot *pSVar2;
  ulong uVar3;
  Move *pMVar4;
  ulong uVar5;
  uint uVar6;
  uchar fromSpotIndex;
  uint uVar7;
  long lVar8;
  long lVar9;
  uchar tableauCardRanks [28];
  uint local_60;
  byte abStack_58 [32];
  Board *local_38;
  
  movePack = movePack_create();
  local_60 = 0;
  pSVar2 = board_spotGet(board,STOCK,'\0');
  uVar6 = 0;
  if (pSVar2->cardsCount != 0) {
    uVar6 = (uint)pSVar2->cards[pSVar2->cardsCount - 1]->rank;
  }
  pSVar2 = board_spotGet(board,WASTE,'\0');
  if (pSVar2->cardsCount != 0) {
    local_60 = (uint)pSVar2->cards[pSVar2->cardsCount - 1]->rank;
  }
  lVar8 = 0;
  do {
    pSVar2 = board_spotGet(board,TABLEAU,(uchar)lVar8);
    if (pSVar2->cardsCount == '\x01') {
      bVar1 = (*pSVar2->cards)->rank;
    }
    else {
      bVar1 = 0;
    }
    abStack_58[lVar8] = bVar1;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x1c);
  uVar3 = 0;
  do {
    if (abStack_58[uVar3] != 0) {
      if (uVar3 == 0) {
        uVar5 = 1;
      }
      else {
        uVar5 = 2;
        if (((2 < uVar3) && (uVar5 = 3, 5 < uVar3)) && (uVar5 = 4, 9 < uVar3)) {
          uVar5 = (ulong)(6 - (uVar3 < 0xf));
        }
      }
      if ((abStack_58[uVar3 + uVar5] != 0) || (abStack_58[(uint)((int)uVar3 + 1 + (int)uVar5)] != 0)
         ) {
        abStack_58[uVar3] = 0;
      }
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x15);
  if (uVar6 == 0xd) {
    pMVar4 = move_create(MOVE,STOCK,'\0',-1,FOUNDATION,'\0',-1);
    movePack_add(movePack,pMVar4);
  }
  if (local_60 == 0xd) {
    pMVar4 = move_create(MOVE,WASTE,'\0',-1,FOUNDATION,'\0',-1);
    movePack_add(movePack,pMVar4);
  }
  local_38 = board;
  if (((uVar6 != 0) && (local_60 != 0)) && (local_60 + uVar6 == 0xd)) {
    pyramid_addCombineMove(movePack,STOCK,'\0',WASTE,'\0');
  }
  lVar8 = 0;
  do {
    uVar7 = (uint)abStack_58[lVar8];
    if (abStack_58[lVar8] != 0) {
      fromSpotIndex = (uchar)lVar8;
      if (uVar7 == 0xd) {
        pMVar4 = move_create(MOVE,TABLEAU,fromSpotIndex,-1,FOUNDATION,'\0',-1);
        movePack_add(movePack,pMVar4);
      }
      if ((uVar6 != 0) && (uVar6 + uVar7 == 0xd)) {
        pyramid_addCombineMove(movePack,STOCK,'\0',TABLEAU,fromSpotIndex);
      }
      if ((local_60 != 0) && (local_60 + uVar7 == 0xd)) {
        pyramid_addCombineMove(movePack,WASTE,'\0',TABLEAU,fromSpotIndex);
      }
      lVar9 = 0;
      do {
        if (((lVar8 != lVar9) && (abStack_58[lVar9] != 0)) && (abStack_58[lVar9] + uVar7 == 0xd)) {
          pyramid_addCombineMove(movePack,TABLEAU,fromSpotIndex,TABLEAU,(uchar)lVar9);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x1c);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x1c);
  if (uVar6 != 0) {
    pMVar4 = move_create(MOVE,STOCK,'\0',-1,WASTE,'\0',-1);
    movePack_add(movePack,pMVar4);
  }
  if ((((gConfig.game)->id == PYRAMIDEASY) || ((gConfig.game)->id == PYRAMIDRELAXEDEASY)) &&
     ((local_60 != 0 && (uVar6 == 0)))) {
    bVar1 = *local_38->gameState;
    if (bVar1 < 2) {
      *(byte *)local_38->gameState = bVar1 + 1;
      pMVar4 = move_create(MOVEREVERSED,WASTE,'\0',0,STOCK,'\0',-1);
      movePack_add(movePack,pMVar4);
    }
  }
  return movePack;
}

Assistant:

MovePack * pyramid_movePackGet(Board * board)
{
	MovePack * movePack = movePack_create();
	Spot * stock = board_spotGet(board, STOCK, 0);
	unsigned char stockCardRank = stock->cardsCount>0 ? stock->cards[stock->cardsCount-1]->rank : 0;
	Spot * waste = board_spotGet(board, WASTE, 0);
	unsigned char wasteCardRank = waste->cardsCount>0 ? waste->cards[waste->cardsCount-1]->rank : 0;
	unsigned char tableauCardRanks[28];
	Spot * spot;
	unsigned char i, j, y, tableauCardRank;

	// Get our tableau cards
	for(i=0;i<28;i++)
	{
		spot = board_spotGet(board, TABLEAU, i);
		if(spot->cardsCount==1)
			tableauCardRanks[i] = spot->cards[0]->rank;
		else
			tableauCardRanks[i] = 0;
	}

	// Remove those that are covered up by others
	for(i=0;i<=20;i++)
	{
		if(tableauCardRanks[i]==0)
			continue;

		y = (i==0 ? 1 : (i<=2 ? 2 : (i<=5 ? 3 : (i<=9 ? 4 : (i<=14 ? 5 : 6)))));

		if(tableauCardRanks[i+y]!=0 || tableauCardRanks[i+y+1]!=0)
		{
			tableauCardRanks[i] = 0;
			continue;
		}
	}

	// Stock or Waste Kings
	if(stockCardRank==13)
		movePack_add(movePack, move_create(MOVE, STOCK, 0, -1, FOUNDATION, 0, -1));
	if(wasteCardRank==13)
		movePack_add(movePack, move_create(MOVE, WASTE, 0, -1, FOUNDATION, 0, -1));

	// Waste+Stock
	if(stockCardRank!=0 && wasteCardRank!=0 && stockCardRank+wasteCardRank==13)
		pyramid_addCombineMove(movePack, STOCK, 0, WASTE, 0);

	// Tableau
	for(i=0;i<28;i++)
	{
		if(tableauCardRanks[i]==0)
			continue;

		tableauCardRank = tableauCardRanks[i];

		// Tableau King
		if(tableauCardRank==13)
			movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, FOUNDATION, 0, -1));

		// Stock+Tableau
		if(stockCardRank!=0 && stockCardRank+tableauCardRank==13)
			pyramid_addCombineMove(movePack, STOCK, 0, TABLEAU, i);

		// Waste+Tableau
		if(wasteCardRank!=0 && wasteCardRank+tableauCardRank==13)
			pyramid_addCombineMove(movePack, WASTE, 0, TABLEAU, i);

		// Tableau+Tableau
		for(j=0;j<28;j++)
		{
			if(i==j || tableauCardRanks[j]==0)
				continue;
		
			if(tableauCardRank+tableauCardRanks[j]==13)
				pyramid_addCombineMove(movePack, TABLEAU, i, TABLEAU, j);
		}
	}

	// Stock->Waste
	if(stockCardRank!=0)
		movePack_add(movePack, move_create(MOVE, STOCK, 0, -1, WASTE, 0, -1));

	if((gConfig.game->id==PYRAMIDEASY || gConfig.game->id==PYRAMIDRELAXEDEASY) && wasteCardRank!=0 && stockCardRank==0 && *(unsigned char *)board->gameState<2)
	{
		*(unsigned char *)board->gameState = (*(unsigned char *)board->gameState)+1;
		movePack_add(movePack, move_create(MOVEREVERSED, WASTE, 0, 0, STOCK, 0, -1));
	}

	return movePack;
}